

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_minelements
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint32_t *min,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  lysp_stmt *plStack_60;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  unsigned_long_long num;
  char *ptr;
  lysp_ext_instance **pplStack_38;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  uint32_t *min_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  pplStack_38 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)min;
  min_local = (uint32_t *)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if ((*flags & 0x200) == 0) {
    *flags = *flags | 0x200;
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar2 = strlen(*(char **)(min_local + 2));
      ptr._4_4_ = (uint)sVar2;
      if (((ptr._4_4_ == 0) ||
          (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)**(char **)(min_local + 2)] & 0x800) == 0))
         || ((**(char **)(min_local + 2) == '0' && (1 < (int)ptr._4_4_)))) {
        if (stmt_local == (lysp_stmt *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(stmt_local[1].stmt + 8) +
                        (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
        }
        ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                (ulong)ptr._4_4_,*(undefined8 *)(min_local + 2),"min-elements");
        ctx_local._4_4_ = LY_EVALID;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtoull(*(char **)(min_local + 2),(char **)&num,10);
        if (num - *(long *)(min_local + 2) == (long)(int)ptr._4_4_) {
          piVar4 = __errno_location();
          if ((*piVar4 == 0x22) || (0xffffffff < uVar5)) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_88 = (ly_ctx *)0x0;
            }
            else {
              local_88 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                    (ulong)ptr._4_4_,*(undefined8 *)(min_local + 2),"min-elements");
            ctx_local._4_4_ = LY_EVALID;
          }
          else {
            *(int *)flags_local = (int)uVar5;
            for (plStack_60 = *(lysp_stmt **)(min_local + 10); plStack_60 != (lysp_stmt *)0x0;
                plStack_60 = plStack_60->next) {
              if (plStack_60->kw != LY_STMT_EXTENSION_INSTANCE) {
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_90 = (ly_ctx *)0x0;
                }
                else {
                  local_90 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                pcVar6 = lyplg_ext_stmt2str(plStack_60->kw);
                ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"min-elements");
                return LY_EVALID;
              }
              LVar1 = lysp_stmt_ext((lysp_ctx *)stmt_local,plStack_60,LY_STMT_MIN_ELEMENTS,0,
                                    pplStack_38);
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
            }
            ctx_local._4_4_ = LY_SUCCESS;
          }
        }
        else {
          if (stmt_local == (lysp_stmt *)0x0) {
            local_80 = (ly_ctx *)0x0;
          }
          else {
            local_80 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(stmt_local[1].stmt + 8) +
                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  (ulong)ptr._4_4_,*(undefined8 *)(min_local + 2),"min-elements");
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","min-elements");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_minelements(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint32_t *min, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr;
    unsigned long long num;

    if (*flags & LYS_SET_MIN) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "min-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MIN;

    /* get value */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);

    if (!arg_len || !isdigit(stmt->arg[0]) || ((stmt->arg[0] == '0') && (arg_len > 1))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }

    errno = 0;
    num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }
    if ((errno == ERANGE) || (num > UINT32_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }
    *min = num;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_MIN_ELEMENTS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "min-elements");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}